

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O1

void __thiscall
SmallDenseMap<TypedFunctionInstanceRequest,_ExprBase_*,_TypedFunctionInstanceRequestHasher,_32U>::
SmallDenseMap(SmallDenseMap<TypedFunctionInstanceRequest,_ExprBase_*,_TypedFunctionInstanceRequestHasher,_32U>
              *this,Allocator *allocator)

{
  undefined8 *puVar1;
  long lVar2;
  
  lVar2 = 0x18;
  do {
    *(undefined4 *)((long)this->storage + lVar2 + -0x18) = 0;
    puVar1 = (undefined8 *)((long)this->storage + lVar2 + -0x10);
    *puVar1 = 0;
    puVar1[1] = 0;
    lVar2 = lVar2 + 0x20;
  } while (lVar2 != 0x418);
  this->allocator = allocator;
  this->bucketCount = 0x20;
  this->count = 0;
  this->data = this->storage;
  NULLC::fillMemory(this->storage,0,0x400);
  return;
}

Assistant:

SmallDenseMap(Allocator *allocator = 0): allocator(allocator)
	{
		assert(N >= 2 && "size is too small");
		assert((N & (N - 1)) == 0 && "only power of 2 sizes are supported");

		bucketCount = N;

		count = 0;

		data = storage;

		NULLC::fillMemory(data, 0, sizeof(Node) * bucketCount);
	}